

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

void addASequenceToList(StringBuffer *sequences,Vector *seqLengths,long *firstSequenceLength,
                       StringBuffer *names,Vector *nameLengths)

{
  unsigned_long uVar1;
  long lVar2;
  ostream *poVar3;
  Vector *lengths;
  char *pcVar4;
  unsigned_long in_RCX;
  long *in_RDX;
  Vector *in_RSI;
  StringBuffer *in_RDI;
  Vector *in_R8;
  unsigned_long in_stack_ffffffffffffffa0;
  Vector *in_stack_ffffffffffffffa8;
  StringBuffer *in_stack_ffffffffffffffb0;
  StringBuffer *in_stack_ffffffffffffffb8;
  
  StringBuffer::appendChar
            (in_stack_ffffffffffffffb0,(char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
  StringBuffer::length(in_RDI);
  Vector::appendValue((Vector *)in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8);
  uVar1 = Vector::length(in_RSI);
  if (uVar1 == 2) {
    lVar2 = stringLength(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    *in_RDX = lVar2;
    if (*in_RDX < 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"First sequence length must be positive.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
  }
  else {
    Vector::length(in_RSI);
    lVar2 = stringLength(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (lVar2 != *in_RDX) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"All sequences must have the same length (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDX);
      lengths = (Vector *)std::operator<<(poVar3,"), but sequence \'");
      Vector::length(in_R8);
      pcVar4 = stringText(in_stack_ffffffffffffffb8,lengths,(unsigned_long)in_R8);
      poVar3 = std::operator<<((ostream *)lengths,pcVar4);
      poVar3 = std::operator<<(poVar3,"\' had length ");
      Vector::length(in_RSI);
      lVar2 = stringLength(in_R8,in_RCX);
      std::ostream::operator<<(poVar3,lVar2);
      exit(1);
    }
  }
  return;
}

Assistant:

void addASequenceToList (StringBuffer& sequences, Vector& seqLengths, long &firstSequenceLength, StringBuffer& names, Vector& nameLengths)
{
  sequences.appendChar ('\0');
  seqLengths.appendValue (sequences.length());
  if (seqLengths.length() == 2)
      {
    firstSequenceLength = stringLength (seqLengths, 0);
    
    if (firstSequenceLength <= 0)
        {
      cerr << "First sequence length must be positive." << endl;
      exit (1);
        }
      }
  else
      {
    if (stringLength (seqLengths, seqLengths.length()-2) != firstSequenceLength)
        {
      cerr << "All sequences must have the same length (" << firstSequenceLength << "), but sequence '" << stringText (names, nameLengths, nameLengths.length()-2) << "' had length " << stringLength (seqLengths, seqLengths.length()-2);
      exit (1);
        }
      }
}